

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O3

Status __thiscall spvtools::opt::AmdExtensionToKhrPass::Process(AmdExtensionToKhrPass *this)

{
  _Rb_tree_header *p_Var1;
  IRContext *pIVar2;
  pointer puVar3;
  pointer pIVar4;
  Instruction *pIVar5;
  AmdExtensionToKhrPass *pAVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var7;
  AmdExtFoldingRules *this_00;
  long *plVar8;
  Operand *pOVar9;
  const_iterator cVar10;
  pointer puVar11;
  pointer pIVar12;
  Module *pMVar13;
  _Alloc_node _Var14;
  Status SVar15;
  long lVar16;
  Instruction *inst;
  Instruction *pIVar17;
  bool changed;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_be_killed;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ext_to_remove;
  byte local_101;
  AmdExtensionToKhrPass *local_100;
  _Alloc_node local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Stack_f0;
  long local_e8;
  IRContext *local_d8;
  long *local_d0;
  AmdExtFoldingRules *local_c8;
  _Any_data local_c0;
  undefined1 local_b0 [32];
  IRContext *local_90;
  pointer local_80 [4];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_101 = 0;
  pIVar2 = (this->super_Pass).context_;
  this_00 = (AmdExtFoldingRules *)operator_new(0x90);
  (this_00->super_FoldingRules).rules_._M_h._M_buckets =
       &(this_00->super_FoldingRules).rules_._M_h._M_single_bucket;
  (this_00->super_FoldingRules).rules_._M_h._M_bucket_count = 1;
  (this_00->super_FoldingRules).rules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->super_FoldingRules).rules_._M_h._M_element_count = 0;
  (this_00->super_FoldingRules).rules_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->super_FoldingRules).rules_._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->super_FoldingRules).rules_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_FoldingRules).context_ = pIVar2;
  (this_00->super_FoldingRules).empty_vector_.
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_FoldingRules).empty_vector_.
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_FoldingRules).empty_vector_.
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_FoldingRules)._vptr_FoldingRules = (_func_int **)&PTR__FoldingRules_00b08e50;
  plVar8 = (long *)operator_new(0x90);
  plVar8[1] = (long)(plVar8 + 7);
  plVar8[2] = 1;
  plVar8[3] = 0;
  plVar8[4] = 0;
  *(undefined4 *)(plVar8 + 5) = 0x3f800000;
  plVar8[6] = 0;
  plVar8[7] = 0;
  *(undefined4 *)(plVar8 + 9) = 0;
  plVar8[10] = 0;
  plVar8[0xb] = (long)(plVar8 + 9);
  plVar8[0xc] = (long)(plVar8 + 9);
  plVar8[0xd] = 0;
  plVar8[0xe] = (long)pIVar2;
  plVar8[0xf] = 0;
  plVar8[0x10] = 0;
  plVar8[0x11] = 0;
  *plVar8 = (long)&PTR__ConstantFoldingRules_00b08e90;
  local_d8 = pIVar2;
  local_d0 = plVar8;
  local_c8 = this_00;
  anon_unknown_7::AmdExtFoldingRules::AddFoldingRules(this_00);
  (**(code **)(*plVar8 + 0x10))(plVar8);
  pMVar13 = (((this->super_Pass).context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar11 = *(pointer *)
             &(pMVar13->functions_).
              super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              ._M_impl;
  puVar3 = (pMVar13->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_100 = this;
  if (puVar11 != puVar3) {
    do {
      local_c0._M_unused._M_object = &local_101;
      local_b0._8_8_ =
           std::
           _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp:932:22)>
           ::_M_invoke;
      local_b0._0_8_ =
           std::
           _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp:932:22)>
           ::_M_manager;
      local_c0._8_8_ = &local_d8;
      opt::Function::ForEachInst
                ((Function *)
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ,(function<void_(spvtools::opt::Instruction_*)> *)&local_c0,false,false);
      if ((_func_int **)local_b0._0_8_ != (_func_int **)0x0) {
        (*(code *)local_b0._0_8_)(&local_c0,&local_c0,3);
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar3);
  }
  local_c0._M_unused._M_object = local_b0;
  local_60._M_impl._0_8_ = (pointer)0x15;
  lVar16 = 0;
  local_c0._M_unused._0_8_ =
       (undefined8)std::__cxx11::string::_M_create((ulong *)local_c0._M_pod_data,(ulong)&local_60);
  local_b0._0_8_ = local_60._M_impl._0_8_;
  (((Instruction *)local_c0._M_unused._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)0x5f444d415f565053;
  (((Instruction *)local_c0._M_unused._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  next_node_ = (Instruction *)0x625f726564616873;
  *(undefined8 *)
   ((long)&(((Instruction *)local_c0._M_unused._0_8_)->
           super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ + 5) = 0x746f6c6c61625f72
  ;
  local_c0._8_8_ = local_60._M_impl._0_8_;
  *(undefined1 *)
   ((long)&(((Instruction *)local_c0._M_unused._0_8_)->
           super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase +
   local_60._M_impl._0_8_) = 0;
  local_b0._16_8_ = &local_90;
  local_60._M_impl._0_8_ = (IRContext *)0x1d;
  local_b0._16_8_ = std::__cxx11::string::_M_create((ulong *)(local_b0 + 0x10),(ulong)&local_60);
  local_90 = (IRContext *)local_60._M_impl._0_8_;
  builtin_strncpy((char *)((long)&(((Instruction *)local_b0._16_8_)->
                                  super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ +
                          5),"r_trinar",8);
  builtin_strncpy((char *)((long)&(((Instruction *)local_b0._16_8_)->
                                  super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                  previous_node_ + 5),"y_minmax",8);
  (((Instruction *)local_b0._16_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)0x5f444d415f565053;
  (((Instruction *)local_b0._16_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_
       = (Instruction *)0x745f726564616873;
  local_b0._24_8_ = local_60._M_impl._0_8_;
  *(undefined1 *)
   ((long)&(((Instruction *)local_b0._16_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
           _vptr_IntrusiveNodeBase + local_60._M_impl._0_8_) = 0;
  pIVar12 = (pointer)(local_80 + 2);
  local_60._M_impl._0_8_ = (pointer)0x12;
  local_80[0] = pIVar12;
  local_80[0] = (pointer)std::__cxx11::string::_M_create((ulong *)local_80,(ulong)&local_60);
  local_80[2] = (pointer)local_60._M_impl._0_8_;
  (local_80[0]->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)0x5f444d415f565053;
  (local_80[0]->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
       (Instruction *)0x646168735f6e6367;
  *(undefined2 *)&(local_80[0]->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_
       = 0x7265;
  local_80[1] = (pointer)local_60._M_impl._0_8_;
  *(undefined1 *)
   ((long)&(local_80[0]->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
           _vptr_IntrusiveNodeBase + local_60._M_impl._0_8_) = 0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_t = &local_60;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_60,(const_iterator)p_Var1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&local_c0 + lVar16),&local_f8);
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0x60);
  lVar16 = -0x60;
  do {
    pIVar4 = pIVar12[-1].dbg_line_insts_.
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pIVar12 != pIVar4) {
      operator_delete(pIVar4,(ulong)((long)&(((pointer)
                                             (pIVar12->
                                             super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                             _vptr_IntrusiveNodeBase)->
                                            super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                            _vptr_IntrusiveNodeBase + 1));
    }
    pIVar12 = (pointer)&pIVar12[-1].dbg_line_insts_;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0);
  local_f8._M_t =
       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  p_Stack_f0 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
  local_e8 = 0;
  pMVar13 = (((local_100->super_Pass).context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar5 = &(pMVar13->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar17 = (pMVar13->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar17 != pIVar5) {
    do {
      if (pIVar17->opcode_ == OpExtension) {
        pOVar9 = Instruction::GetInOperand(pIVar17,0);
        Operand::AsString_abi_cxx11_((string *)&local_c0,pOVar9);
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_60,(key_type *)&local_c0);
        if ((Instruction *)local_c0._M_unused._0_8_ != (Instruction *)local_b0) {
          operator_delete(local_c0._M_unused._M_object,
                          (ulong)((long)&((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                                         local_b0._0_8_)->_vptr_IntrusiveNodeBase + 1));
        }
        if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
          local_c0._M_unused._0_8_ = (undefined8)pIVar17;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_f8,(Instruction **)&local_c0);
        }
      }
      pIVar17 = (pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar17 != pIVar5);
    pMVar13 = (((local_100->super_Pass).context_)->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar17 = (pMVar13->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar5 = &(pMVar13->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar17 != pIVar5) {
    do {
      if (pIVar17->opcode_ == OpExtInstImport) {
        pOVar9 = Instruction::GetInOperand(pIVar17,0);
        Operand::AsString_abi_cxx11_((string *)&local_c0,pOVar9);
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_60,(key_type *)&local_c0);
        if ((Instruction *)local_c0._M_unused._0_8_ != (Instruction *)local_b0) {
          operator_delete(local_c0._M_unused._M_object,
                          (ulong)((long)&((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                                         local_b0._0_8_)->_vptr_IntrusiveNodeBase + 1));
        }
        if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
          local_c0._M_unused._0_8_ = (undefined8)pIVar17;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_f8,(Instruction **)&local_c0);
        }
      }
      pIVar17 = (pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar17 != pIVar5);
  }
  p_Var7 = p_Stack_f0;
  pAVar6 = local_100;
  _Var14._M_t = local_f8._M_t;
  if (local_f8._M_t == p_Stack_f0) {
    SVar15 = SuccessWithoutChange;
    if ((local_101 & 1) == 0) goto LAB_00522860;
  }
  else {
    do {
      IRContext::KillInst((pAVar6->super_Pass).context_,
                          *(Instruction **)&((_Rb_tree_header *)_Var14._M_t)->_M_header);
      local_101 = 1;
      _Var14._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          *)&((_Rb_tree_header *)_Var14._M_t)->_M_header)->super__Rb_tree_header;
    } while (_Var14._M_t != p_Var7);
  }
  pMVar13 = (((pAVar6->super_Pass).context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  SVar15 = SuccessWithChange;
  if ((pMVar13->header_).version < 0x10300) {
    (pMVar13->header_).version = 0x10300;
  }
LAB_00522860:
  if (local_f8._M_t !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    operator_delete(local_f8._M_t,local_e8 - (long)local_f8._M_t);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_c8 != (AmdExtFoldingRules *)0x0) {
    (*(local_c8->super_FoldingRules)._vptr_FoldingRules[1])();
  }
  local_c8 = (AmdExtFoldingRules *)0x0;
  if (local_d0 != (long *)0x0) {
    (**(code **)(*local_d0 + 8))();
  }
  return SVar15;
}

Assistant:

Pass::Status AmdExtensionToKhrPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<AmdExtFoldingRules>(new AmdExtFoldingRules(context())),
      MakeUnique<AmdExtConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  // Now that instruction that require the extensions have been removed, we can
  // remove the extension instructions.
  std::set<std::string> ext_to_remove = {"SPV_AMD_shader_ballot",
                                         "SPV_AMD_shader_trinary_minmax",
                                         "SPV_AMD_gcn_shader"};

  std::vector<Instruction*> to_be_killed;
  for (Instruction& inst : context()->module()->extensions()) {
    if (inst.opcode() == spv::Op::OpExtension) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction& inst : context()->ext_inst_imports()) {
    if (inst.opcode() == spv::Op::OpExtInstImport) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction* inst : to_be_killed) {
    context()->KillInst(inst);
    changed = true;
  }

  // The replacements that take place use instructions that are missing before
  // SPIR-V 1.3. If we changed something, we will have to make sure the version
  // is at least SPIR-V 1.3 to make sure those instruction can be used.
  if (changed) {
    uint32_t version = get_module()->version();
    if (version < 0x00010300 /*1.3*/) {
      get_module()->set_version(0x00010300);
    }
  }
  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}